

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O1

_Bool effect_damages(effect *effect)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  effect *effect_00;
  int iVar5;
  
  if ((effect->index == 0x7a) || (effect->index == 1)) {
    effect_00 = effect->next;
    iVar5 = 1;
    iVar3 = dice_evaluate(effect->dice,0,AVERAGE,(random_value *)0x0);
    bVar1 = 0 < iVar3 && effect_00 != (effect *)0x0;
    if (0 < iVar3 && effect_00 != (effect *)0x0) {
      do {
        _Var2 = effect_damages(effect_00);
        if (_Var2) {
          return true;
        }
        effect_00 = effect_00->next;
        bVar1 = iVar5 < iVar3 && effect_00 != (effect *)0x0;
        iVar5 = iVar5 + 1;
      } while (bVar1);
    }
  }
  else {
    pcVar4 = effect_info(effect);
    if (pcVar4 == (char *)0x0) {
      bVar1 = false;
    }
    else {
      pcVar4 = effect_info(effect);
      iVar3 = strcmp(pcVar4,"dam");
      bVar1 = iVar3 == 0;
    }
  }
  return bVar1;
}

Assistant:

bool effect_damages(const struct effect *effect)
{
	if (effect->index == EF_RANDOM || effect->index == EF_SELECT) {
		// Random or select effect
		struct effect *e = effect->next;
		int num_subeffects = dice_evaluate(effect->dice, 0, AVERAGE, NULL);

		// Check if any of the subeffects do damage
		for (int i = 0; e != NULL && i < num_subeffects; i++) {
			if (effect_damages(e)) {
				return true;
			}
			e = e->next;
		}
		return false;
	} else {
		// Not a random or select effect, check the info string for
		// damage
		return effect_info(effect) != NULL &&
			streq(effect_info(effect), "dam");
	}
}